

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

fdb_status wal_destroy(filemgr *file)

{
  wal *pwVar1;
  size_t sVar2;
  long lVar3;
  
  pwVar1 = file->wal;
  sVar2 = pwVar1->num_shards;
  if (sVar2 != 0) {
    lVar3 = 0x10;
    do {
      pthread_spin_destroy
                ((pthread_spinlock_t *)((long)&(file->wal->key_shards->_map).root + lVar3));
      if (file->config->seqtree_opt == '\x01') {
        pthread_spin_destroy
                  ((pthread_spinlock_t *)((long)&(file->wal->seq_shards->_map).root + lVar3));
      }
      lVar3 = lVar3 + 0x18;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
    pwVar1 = file->wal;
  }
  pthread_spin_destroy(&pwVar1->lock);
  free(file->wal->key_shards);
  if (file->config->seqtree_opt == '\x01') {
    free(file->wal->seq_shards);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_destroy(struct filemgr *file)
{
    size_t i = 0;
    size_t num_shards = wal_get_num_shards(file);
    // Free all WAL shards
    for (; i < num_shards; ++i) {
        spin_destroy(&file->wal->key_shards[i].lock);
        if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
            spin_destroy(&file->wal->seq_shards[i].lock);
        }
    }
    spin_destroy(&file->wal->lock);
    free(file->wal->key_shards);
    if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
        free(file->wal->seq_shards);
    }
    return FDB_RESULT_SUCCESS;
}